

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

void If_DsdManPrint(If_DsdMan_t *p,char *pFileName,int Number,int Support,int fOccurs,int fTtDump,
                   int fVerbose)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Gia_Man_t *pGVar3;
  void *pvVar4;
  int iVar5;
  FILE *__s;
  Vec_Int_t *p_00;
  int *piVar6;
  Vec_Int_t *p_01;
  int *__ptr;
  char *pcVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  FILE *pFVar11;
  char *pcVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  __s = _stdout;
  if (pFileName != (char *)0x0) {
    __s = fopen(pFileName,"wb");
  }
  if (__s == (FILE *)0x0 && pFileName != (char *)0x0) {
    puts("cannot open output file");
    return;
  }
  if (fVerbose != 0) {
    fwrite("*****  NOTATIONS USED BELOW  *****\n",0x23,1,__s);
    fwrite("Support -- the support size\n",0x1c,1,__s);
    fwrite("Obj     -- the number of nodes in the DSD manager for each support size\n",0x48,1,__s);
    fwrite("           (the constant node and the primary input node have no support)\n",0x4a,1,__s)
    ;
    fwrite("ObjNDSD -- the number of prime nodes (that is, nodes whose function has no DSD)\n",0x50,
           1,__s);
    fwrite("           (percentage is relative to the number of all nodes of that size)\n",0x4c,1,
           __s);
    fwrite("NPNNDSD -- the number of different NPN classes of prime nodes\n",0x3e,1,__s);
    fwrite("           (Each NPN class may appear more than once. For example: F1 = 17(ab(cd))\n",
           0x53,1,__s);
    fwrite("           and F2 = 17(ab[cd]) both have prime majority node (hex TT is 17),\n",0x4d,1,
           __s);
    fwrite("           but in one case the majority node is fed by AND, and in another by XOR.\n",
           0x53,1,__s);
    fwrite("           These two majority nodes are different nodes in the DSD manager\n",0x4b,1,__s
          );
    fwrite("Str     -- the number of structures for each support size\n",0x3a,1,__s);
    fwrite("           (each structure is composed of one or more nodes)\n",0x3d,1,__s);
    fwrite("StrNDSD -- the number of DSD structures containing at least one prime node\n",0x4b,1,__s
          );
    fwrite("Marked  -- the number of DSD structures matchable with the LUT structure (say, \"44\")\n"
           ,0x55,1,__s);
  }
  if (0 < (p->vObjs).nSize) {
    lVar9 = 0;
    do {
      piVar6 = (int *)(p->vObjs).pArray[lVar9];
      If_DsdManCheckNonDec_rec(p,*piVar6);
      iVar5 = *piVar6;
      if (((iVar5 < 0) || (iVar1 = (p->vObjs).nSize, iVar1 <= iVar5)) || (iVar1 <= lVar9))
      goto LAB_00424d98;
      lVar9 = lVar9 + 1;
    } while (lVar9 < (p->vObjs).nSize);
  }
  uVar10 = 0;
  if (p->nVars < 3) {
    dVar17 = 0.0;
  }
  else {
    lVar9 = 3;
    iVar5 = 0;
    do {
      pVVar2 = p->vTtDecs[lVar9];
      if (pVVar2 == (Vec_Ptr_t *)0x0) {
        dVar17 = 0.0;
      }
      else {
        iVar1 = pVVar2->nCap;
        auVar18._8_4_ = iVar1 >> 0x1f;
        auVar18._0_8_ = (long)iVar1;
        auVar18._12_4_ = 0x45300000;
        dVar17 = ((auVar18._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,iVar1) - 4503599627370496.0)) * 8.0 + 16.0;
        if (0 < (long)pVVar2->nSize) {
          lVar13 = 0;
          do {
            if ((int *)pVVar2->pArray[lVar13] != (int *)0x0) {
              iVar1 = *pVVar2->pArray[lVar13];
              auVar19._8_4_ = iVar1 >> 0x1f;
              auVar19._0_8_ = (long)iVar1;
              auVar19._12_4_ = 0x45300000;
              dVar17 = dVar17 + ((auVar19._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,iVar1) - 4503599627370496.0)) * 4.0 +
                                16.0;
            }
            lVar13 = lVar13 + 1;
          } while (pVVar2->nSize != lVar13);
        }
      }
      iVar5 = iVar5 + p->vTtMem[lVar9]->nEntries * p->vTtMem[lVar9]->nEntrySize;
      uVar8 = (int)uVar10 + (int)dVar17;
      uVar10 = (ulong)uVar8;
      lVar9 = lVar9 + 1;
    } while (lVar9 != (ulong)(uint)p->nVars + 1);
    uVar10 = (ulong)iVar5;
    dVar17 = (double)(int)uVar8 * 9.5367431640625e-07;
  }
  If_DsdManPrintDistrib(p);
  lVar9 = (long)(p->vObjs).nSize;
  pcVar12 = "yes";
  pcVar7 = "no";
  if (0 < lVar9) {
    lVar13 = 0;
    do {
      if ((*(byte *)((long)(p->vObjs).pArray[lVar13] + 5) & 1) != 0) {
        pcVar7 = "yes";
        goto LAB_00424890;
      }
      lVar13 = lVar13 + 1;
    } while (lVar9 != lVar13);
    pcVar7 = "no";
  }
LAB_00424890:
  if (p->fNewAsUseless == 0) {
    pcVar12 = "no";
  }
  printf("Number of inputs = %d.  LUT size = %d.  Marks = %s.  NewAsUseless = %s.  Bookmark = %d.\n"
         ,(ulong)(uint)p->nVars,(ulong)(uint)p->LutSize,pcVar7,pcVar12,(ulong)(uint)p->nObjsPrev);
  if (p->pCellStr != (char *)0x0) {
    printf("Symbolic cell description: %s\n");
  }
  pGVar3 = p->pTtGia;
  if (pGVar3 != (Gia_Man_t *)0x0) {
    fprintf(__s,"Non-DSD AIG nodes          = %8d\n",
            (ulong)(uint)(~(pGVar3->vCos->nSize + pGVar3->vCis->nSize) + pGVar3->nObjs));
  }
  fprintf(__s,"Unique table misses        = %8d\n",(ulong)(uint)p->nUniqueMisses);
  fprintf(__s,"Unique table hits          = %8d\n",(ulong)(uint)p->nUniqueHits);
  iVar5 = Mem_FlexReadMemUsage(p->pMem);
  fprintf(__s,"Memory used for objects    = %8.2f MB.\n",(double)iVar5 * 9.5367431640625e-07);
  lVar9 = uVar10 + (long)(p->vTruths).nCap * 4;
  auVar16._8_4_ = (int)((ulong)lVar9 >> 0x20);
  auVar16._0_8_ = lVar9;
  auVar16._12_4_ = 0x45300000;
  fprintf(__s,"Memory used for functions  = %8.2f MB.\n",
          ((auVar16._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) * 8.0 *
          9.5367431640625e-07);
  fprintf(__s,"Memory used for hash table = %8.2f MB.\n",
          (double)((p->vNexts).nCap + p->nBins) * 4.0 * 9.5367431640625e-07);
  fprintf(__s,"Memory used for bound sets = %8.2f MB.\n",dVar17);
  pFVar11 = __s;
  fprintf(__s,"Memory used for array      = %8.2f MB.\n",
          (double)(p->vObjs).nCap * 8.0 * 9.5367431640625e-07);
  iVar5 = (int)pFVar11;
  pGVar3 = p->pTtGia;
  if (pGVar3 != (Gia_Man_t *)0x0) {
    pFVar11 = __s;
    fprintf(__s,"Memory used for AIG        = %8.2f MB.\n",
            (double)(~(pGVar3->vCos->nSize + pGVar3->vCis->nSize) + pGVar3->nObjs) * 8.0 *
            9.5367431640625e-07);
    iVar5 = (int)pFVar11;
  }
  lVar9 = p->timeDsd;
  if (lVar9 != 0) {
    Abc_Print(iVar5,"%s =","Time DSD   ");
    Abc_Print(iVar5,"%9.2f sec\n",(double)lVar9 / 1000000.0);
    lVar9 = p->timeCanon;
    lVar13 = p->timeCheck;
    Abc_Print(iVar5,"%s =","Time canon ");
    Abc_Print(iVar5,"%9.2f sec\n",(double)(lVar9 - lVar13) / 1000000.0);
    lVar9 = p->timeCheck;
    Abc_Print(iVar5,"%s =","Time check ");
    Abc_Print(iVar5,"%9.2f sec\n",(double)lVar9 / 1000000.0);
    lVar9 = p->timeCheck2;
    Abc_Print(iVar5,"%s =","Time check2");
    Abc_Print(iVar5,"%9.2f sec\n",(double)lVar9 / 1000000.0);
    lVar9 = p->timeVerify;
    Abc_Print(iVar5,"%s =","Time verify");
    Abc_Print(iVar5,"%9.2f sec\n",(double)lVar9 / 1000000.0);
  }
  if (fOccurs != 0) {
    If_DsdManPrintOccurs((FILE *)_stdout,p);
  }
  if (fTtDump != 0) {
    If_DsdManDumpDsd(p,Support);
    If_DsdManDumpAll(p,Support);
  }
  if (fVerbose != 0) {
    p_00 = (Vec_Int_t *)malloc(0x10);
    p_00->nCap = 1000;
    p_00->nSize = 0;
    piVar6 = (int *)malloc(4000);
    p_00->pArray = piVar6;
    p_01 = (Vec_Int_t *)malloc(0x10);
    p_01->nCap = 1000;
    p_01->nSize = 0;
    piVar6 = (int *)malloc(4000);
    p_01->pArray = piVar6;
    if (0 < (p->vObjs).nSize) {
      uVar10 = 0;
      do {
        pvVar4 = (p->vObjs).pArray[uVar10];
        if (((Number == 0) ||
            ((int)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff) %
                  (long)Number) == 0)) &&
           ((Support == 0 || ((*(uint *)((long)pvVar4 + 4) >> 3 & 0x1f) == Support)))) {
          Vec_IntPush(p_00,(int)uVar10);
          Vec_IntPush(p_01,-(*(uint *)((long)pvVar4 + 4) >> 9 & 0x3ffff));
        }
        uVar10 = uVar10 + 1;
      } while ((long)uVar10 < (long)(p->vObjs).nSize);
    }
    piVar6 = p_01->pArray;
    uVar8 = p_01->nSize;
    __ptr = Abc_MergeSortCost(piVar6,uVar8);
    if (0 < (int)uVar8) {
      uVar10 = 0x14;
      if ((int)uVar8 < 0x14) {
        uVar10 = (ulong)uVar8;
      }
      uVar14 = 0;
      do {
        uVar15 = uVar14 + 1;
        printf("%2d : ",uVar15 & 0xffffffff);
        iVar5 = __ptr[uVar14];
        if (((long)iVar5 < 0) || (p_00->nSize <= iVar5)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar5 = p_00->pArray[iVar5];
        if (((long)iVar5 < 0) || ((p->vObjs).nSize <= iVar5)) {
LAB_00424d98:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        If_DsdManPrintOne((FILE *)__s,p,*(p->vObjs).pArray[iVar5],(uchar *)0x0,1);
        uVar14 = uVar15;
      } while (uVar10 != uVar15);
    }
    if (__ptr != (int *)0x0) {
      free(__ptr);
    }
    if (p_00->pArray != (int *)0x0) {
      free(p_00->pArray);
      p_00->pArray = (int *)0x0;
    }
    free(p_00);
    if (piVar6 != (int *)0x0) {
      free(piVar6);
      p_01->pArray = (int *)0x0;
    }
    free(p_01);
    if (pFileName != (char *)0x0) {
      fclose(__s);
      return;
    }
  }
  return;
}

Assistant:

void If_DsdManPrint( If_DsdMan_t * p, char * pFileName, int Number, int Support, int fOccurs, int fTtDump, int fVerbose )
{
    If_DsdObj_t * pObj;
    Vec_Int_t * vStructs, * vCounts;
    int CountUsed = 0, CountNonDsd = 0, CountNonDsdStr = 0, CountMarked = 0, CountPrime = 0;
    int i, v, * pPerm, DsdMax = 0, MemSizeTTs = 0, MemSizeDecs = 0;
    FILE * pFile;
    pFile = pFileName ? fopen( pFileName, "wb" ) : stdout;
    if ( pFileName && pFile == NULL )
    {
        printf( "cannot open output file\n" );
        return;
    }
    if ( fVerbose )
    {
        fprintf( pFile, "*****  NOTATIONS USED BELOW  *****\n" );
        fprintf( pFile, "Support -- the support size\n" );
        fprintf( pFile, "Obj     -- the number of nodes in the DSD manager for each support size\n" );
        fprintf( pFile, "           (the constant node and the primary input node have no support)\n" );
        fprintf( pFile, "ObjNDSD -- the number of prime nodes (that is, nodes whose function has no DSD)\n" );
        fprintf( pFile, "           (percentage is relative to the number of all nodes of that size)\n" );
        fprintf( pFile, "NPNNDSD -- the number of different NPN classes of prime nodes\n" );
        fprintf( pFile, "           (Each NPN class may appear more than once. For example: F1 = 17(ab(cd))\n" ); 
        fprintf( pFile, "           and F2 = 17(ab[cd]) both have prime majority node (hex TT is 17),\n" ); 
        fprintf( pFile, "           but in one case the majority node is fed by AND, and in another by XOR.\n" );
        fprintf( pFile, "           These two majority nodes are different nodes in the DSD manager\n" );
        fprintf( pFile, "Str     -- the number of structures for each support size\n" );
        fprintf( pFile, "           (each structure is composed of one or more nodes)\n" );
        fprintf( pFile, "StrNDSD -- the number of DSD structures containing at least one prime node\n" );
        fprintf( pFile, "Marked  -- the number of DSD structures matchable with the LUT structure (say, \"44\")\n" );
    }
    If_DsdVecForEachObj( &p->vObjs, pObj, i )
    {
        if ( If_DsdObjType(pObj) == IF_DSD_PRIME )
            DsdMax = Abc_MaxInt( DsdMax, pObj->nFans ); 
        CountPrime += If_DsdObjType(pObj) == IF_DSD_PRIME;
        CountNonDsdStr += If_DsdManCheckNonDec_rec( p, pObj->Id );
        CountUsed += ( If_DsdVecObjRef(&p->vObjs, pObj->Id) > 0 );
        CountMarked += If_DsdVecObjMark( &p->vObjs, i );
    }
    for ( v = 3; v <= p->nVars; v++ )
    {
        CountNonDsd += Vec_MemEntryNum(p->vTtMem[v]);
        MemSizeTTs += Vec_MemEntrySize(p->vTtMem[v]) * Vec_MemEntryNum(p->vTtMem[v]);
        MemSizeDecs += (int)Vec_VecMemoryInt((Vec_Vec_t *)(p->vTtDecs[v]));
    }
    If_DsdManPrintDistrib( p );
    printf( "Number of inputs = %d.  LUT size = %d.  Marks = %s.  NewAsUseless = %s.  Bookmark = %d.\n", 
        p->nVars, p->LutSize, If_DsdManHasMarks(p)? "yes" : "no", p->fNewAsUseless? "yes" : "no", p->nObjsPrev );
    if ( p->pCellStr )
        printf( "Symbolic cell description: %s\n", p->pCellStr );
    if ( p->pTtGia )
    fprintf( pFile, "Non-DSD AIG nodes          = %8d\n", Gia_ManAndNum(p->pTtGia) );
    fprintf( pFile, "Unique table misses        = %8d\n", p->nUniqueMisses );
    fprintf( pFile, "Unique table hits          = %8d\n", p->nUniqueHits );
    fprintf( pFile, "Memory used for objects    = %8.2f MB.\n", 1.0*Mem_FlexReadMemUsage(p->pMem)/(1<<20) );
    fprintf( pFile, "Memory used for functions  = %8.2f MB.\n", 8.0*(MemSizeTTs+sizeof(int)*Vec_IntCap(&p->vTruths))/(1<<20) );
    fprintf( pFile, "Memory used for hash table = %8.2f MB.\n", 1.0*sizeof(int)*(p->nBins+Vec_IntCap(&p->vNexts))/(1<<20) );
    fprintf( pFile, "Memory used for bound sets = %8.2f MB.\n", 1.0*MemSizeDecs/(1<<20) );
    fprintf( pFile, "Memory used for array      = %8.2f MB.\n", 1.0*sizeof(void *)*Vec_PtrCap(&p->vObjs)/(1<<20) );
    if ( p->pTtGia )
    fprintf( pFile, "Memory used for AIG        = %8.2f MB.\n", 8.0*Gia_ManAndNum(p->pTtGia)/(1<<20) );
    if ( p->timeDsd )
    {
        Abc_PrintTime( 1, "Time DSD   ", p->timeDsd    );
        Abc_PrintTime( 1, "Time canon ", p->timeCanon-p->timeCheck  );
        Abc_PrintTime( 1, "Time check ", p->timeCheck  );
        Abc_PrintTime( 1, "Time check2", p->timeCheck2 );
        Abc_PrintTime( 1, "Time verify", p->timeVerify );
    }
    if ( fOccurs )
        If_DsdManPrintOccurs( stdout, p );
//    If_DsdManHashProfile( p );
    if ( fTtDump )
        If_DsdManDumpDsd( p, Support );
    if ( fTtDump )
        If_DsdManDumpAll( p, Support );
//    If_DsdManPrintDecs( stdout, p );
    if ( !fVerbose )
        return;
    vStructs = Vec_IntAlloc( 1000 );
    vCounts  = Vec_IntAlloc( 1000 );
    If_DsdVecForEachObj( &p->vObjs, pObj, i )
    {
        if ( Number && i % Number )
            continue;
        if ( Support && Support != If_DsdObjSuppSize(pObj) )
            continue;
        Vec_IntPush( vStructs, i );
        Vec_IntPush( vCounts, -(int)pObj->Count );
//        If_DsdManPrintOne( pFile, p, pObj->Id, NULL, 1 );
    }
//    fprintf( pFile, "\n" );
    pPerm = Abc_MergeSortCost( Vec_IntArray(vCounts), Vec_IntSize(vCounts) );
    for ( i = 0; i < Abc_MinInt(Vec_IntSize(vCounts), 20); i++ )
    {
        printf( "%2d : ", i+1 );
        pObj = If_DsdVecObj( &p->vObjs, Vec_IntEntry(vStructs, pPerm[i]) );
        If_DsdManPrintOne( pFile, p, pObj->Id, NULL, 1 );
    }
    ABC_FREE( pPerm );
    Vec_IntFree( vStructs );
    Vec_IntFree( vCounts );
    if ( pFileName )
        fclose( pFile );
}